

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O2

bool json::
     save_container<__gnu_cxx::__normal_iterator<obj_array_var1**,std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>>
               (ostream *out,
               __normal_iterator<obj_array_var1_**,_std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>_>
               begin,__normal_iterator<obj_array_var1_**,_std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>_>
                     end,int tabs)

{
  long lVar1;
  
  std::operator<<(out,'[');
  for (lVar1 = 0; begin._M_current + lVar1 != end._M_current; lVar1 = lVar1 + 8) {
    if (lVar1 != 0) {
      std::operator<<(out,',');
    }
    save<obj_array_var1>(out,begin._M_current + lVar1,tabs + 1);
  }
  std::operator<<(out,']');
  return ((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) != 0;
}

Assistant:

bool save_container(std::ostream& out, iterator begin, iterator end, int tabs) {
	out << '[';
	for (iterator i = begin; i != end; ++i) {
		if (i != begin)
			out << ',';
		save(out, *i, tabs + 1);
	}
	out << ']';
	return out.fail();
}